

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationIndex.cpp
# Opt level: O0

unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
 __thiscall
VariationIndex::_getDeletions(VariationIndex *this,int chromosome_id,size_t start,size_t end)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  pointer pvVar4;
  size_t in_RCX;
  long in_RSI;
  __uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
  in_RDI;
  size_t in_R8;
  pair<boost::unordered::iterator_detail::c_iterator<boost::unordered::detail::ptr_node<unsigned_long>_>,_bool>
  pVar5;
  event_t *event;
  size_t i;
  unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  candidates;
  vector<VariationIndex::event_t,_std::allocator<VariationIndex::event_t>_> *event_list;
  size_t k;
  chromosome_record_t *chromosome_record;
  unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *result;
  unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  *in_stack_fffffffffffffee8;
  unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffffef0;
  const_iterator in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  key_type *in_stack_ffffffffffffff08;
  unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  *in_stack_ffffffffffffff10;
  size_t sVar6;
  c_iterator<boost::unordered::detail::ptr_node<unsigned_long>_> local_c8;
  c_iterator<boost::unordered::detail::ptr_node<unsigned_long>_> local_c0;
  node_pointer local_b8;
  undefined1 local_b0;
  const_reference local_98;
  size_t local_90;
  undefined1 local_81;
  mapped_type *local_50;
  ulong local_48;
  mapped_type *local_40;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  local_38;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  local_30;
  size_t local_28;
  size_t local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_30.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
       ::find(in_stack_fffffffffffffee8,(key_type *)0x2a5269);
  local_38.node_ =
       (node_pointer)
       boost::unordered::
       unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
       ::end(in_stack_fffffffffffffee8);
  bVar1 = boost::unordered::iterator_detail::
          iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
          ::operator==(&local_30,&local_38);
  if (bVar1) {
    std::
    unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
    ::unique_ptr<std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  else {
    local_40 = boost::unordered::
               unordered_map<int,_VariationIndex::chromosome_record_t,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
               ::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_48 = (local_20 - 1) / *(ulong *)(in_RSI + 0x78);
    sVar2 = std::vector<VariationIndex::checkpoint_t,_std::allocator<VariationIndex::checkpoint_t>_>
            ::size(&local_40->checkpoint_list);
    if (local_48 < sVar2) {
      local_50 = local_40;
      boost::unordered::
      unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::unordered_set((unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)in_stack_ffffffffffffff10);
      local_81 = 0;
      std::
      unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
      ::
      unique_ptr<std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      pvVar3 = std::
               vector<VariationIndex::checkpoint_t,_std::allocator<VariationIndex::checkpoint_t>_>::
               operator[](&local_40->checkpoint_list,local_48);
      local_90 = pvVar3->index;
      while ((sVar6 = local_90,
             sVar2 = std::vector<VariationIndex::event_t,_std::allocator<VariationIndex::event_t>_>
                     ::size(&local_50->events), sVar6 < sVar2 &&
             (local_98 = std::
                         vector<VariationIndex::event_t,_std::allocator<VariationIndex::event_t>_>::
                         operator[](&local_50->events,local_90), local_98->position <= local_28))) {
        if ((local_98->position == local_20) && (local_98->type == DELETION_START)) {
          pVar5 = boost::unordered::
                  unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::insert((unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                           (value_type_conflict3 *)in_stack_fffffffffffffef8.node_);
          local_b8 = (node_pointer)pVar5.first.node_;
          in_stack_ffffffffffffff07 = pVar5.second;
          local_b0 = in_stack_ffffffffffffff07;
        }
        if ((local_98->position == local_28) && (local_98->type == DELETION_END)) {
          in_stack_fffffffffffffef8 =
               boost::unordered::
               unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               ::find((unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)in_stack_fffffffffffffee8,(key_type_conflict1 *)0x2a54a2);
          local_c0.node_ = in_stack_fffffffffffffef8.node_;
          local_c8.node_ =
               (node_pointer)
               boost::unordered::
               unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               ::end((unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)in_stack_fffffffffffffee8);
          bVar1 = boost::unordered::iterator_detail::operator!=(&local_c0,&local_c8);
          if (bVar1) {
            pvVar4 = std::
                     unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ::get(in_stack_fffffffffffffef0);
            if (pvVar4 == (pointer)0x0) {
              in_stack_fffffffffffffef0 =
                   (unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)operator_new(0x18);
              memset(in_stack_fffffffffffffef0,0,0x18);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2a5519);
              std::
              unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ::
              unique_ptr<std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                        (in_stack_fffffffffffffef0,(pointer)in_stack_fffffffffffffee8);
              std::
              unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator=(in_stack_fffffffffffffef0,
                          (unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)in_stack_fffffffffffffee8);
              std::
              unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::~unique_ptr(in_stack_fffffffffffffef0);
            }
            std::
            unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::operator->((unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)0x2a554b);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                       (value_type_conflict3 *)in_stack_fffffffffffffef8.node_);
          }
        }
        local_90 = local_90 + 1;
      }
      local_81 = 1;
      boost::unordered::
      unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~unordered_set((unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)0x2a55a9);
    }
    else {
      std::
      unique_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
      ::
      unique_ptr<std::default_delete<std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
  }
  return (__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
          )(tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )in_RDI.
             super___uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             .
             super__Head_base<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_false>
             ._M_head_impl;
}

Assistant:

std::unique_ptr<std::vector<size_t> > VariationIndex::_getDeletions(int chromosome_id, size_t start, size_t end) {
	if (chromosomes.find(chromosome_id) == chromosomes.end()) {
		return unique_ptr<vector<size_t> >(nullptr);
	}
	const chromosome_record_t& chromosome_record = chromosomes[chromosome_id];
	size_t k = (start-1) / step_size;
	if (chromosome_record.checkpoint_list.size() <= k) {
		return unique_ptr<vector<size_t> >(nullptr);
	}
	const vector<event_t>& event_list = chromosome_record.events;
	boost::unordered_set<size_t> candidates;
	unique_ptr<vector<size_t> > result(nullptr);
	for (size_t i=chromosome_record.checkpoint_list[k].index; i<event_list.size(); ++i) {
		const event_t& event = event_list[i];
		if (event.position > end) break;
		if ((event.position == start) && (event.type == DELETION_START)) {
			candidates.insert(event.variation_index);
		}
		if ((event.position == end) && (event.type == DELETION_END)) {
			if (candidates.find(event.variation_index) != candidates.end()) {
				if (result.get() == 0) {
					result = unique_ptr<vector<size_t> >(new vector<size_t>());
				}
				result->push_back(event.variation_index);
			}
		}
	}
	return result;
}